

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  MessageLite *pMVar1;
  int iVar2;
  Extension *pEVar3;
  Nonnull<const_char_*> failure_msg;
  undefined4 extraout_var;
  anon_enum_32 local_2c;
  LogMessageFatal local_28;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 == (Extension *)0x0) {
    return default_value;
  }
  local_28.super_LogMessage.errno_saver_.saved_errno_ = pEVar3->is_repeated ^ CPPTYPE_INT32;
  local_2c = OPTIONAL_FIELD;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                          ((anon_enum_32 *)&local_28,&local_2c,
                           "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_28.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar3->type);
    local_2c = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_28,&local_2c,
                             "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pMVar1 = (MessageLite *)(pEVar3->field_0).int64_t_value;
      if ((pEVar3->field_0xa & 4) == 0) {
        return pMVar1;
      }
      iVar2 = (*pMVar1->_vptr_MessageLite[3])(pMVar1,default_value,this->arena_);
      return (MessageLite *)CONCAT44(extraout_var,iVar2);
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x286,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->GetMessage(default_value,
                                                          arena_);
    } else {
      return *extension->ptr.message_value;
    }
  }
}